

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::argument_mode(int *argc,char **argv)

{
  string_code sVar1;
  string *inString;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  print_welcome();
  inString = &local_40;
  std::__cxx11::string::string<std::allocator<char>>((string *)inString,argv[1],&local_61);
  sVar1 = ARG_MODE::hashit(inString);
  std::__cxx11::string::~string((string *)inString);
  switch(sVar1) {
  case e3DModel:
    gather_3D_arg(argc,argv);
    break;
  case eHelp:
    print_help();
    break;
  case eMeshops:
    gather_meshops_arg(argc,argv);
    break;
  case eModeling:
    gather_modeling_arg(argc,argv);
    break;
  case eSlice:
    gather_slice_arg((int *)inString,argv);
    break;
  case eVersion:
    print_version();
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Unrecognized input argument. Try \"-help\" or interactive mode."
               ,(allocator<char> *)&local_40);
    print_ln(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void UI::argument_mode(int &argc, char *argv[])
{
    print_welcome();
    ARG_MODE::string_code input_arg = ARG_MODE::hashit(argv[1]);
    switch (input_arg)
    {
    case ARG_MODE::eHelp:
        print_help();
        break;
    case ARG_MODE::e3DModel:
        gather_3D_arg(argc,argv);
        break;
    case ARG_MODE::eMeshops:
        gather_meshops_arg(argc, argv);
        break;
    case ARG_MODE::eModeling:
        gather_modeling_arg(argc, argv);
        break;
    case ARG_MODE::eSlice:
        gather_slice_arg(argc, argv);
        break;
    case ARG_MODE::eVersion:
        print_version();
        break;
    default:
        print_ln("Unrecognized input argument. Try \"-help\" or interactive mode.");
        break;
    }
}